

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O2

size_t hd_strlcat(char *dst,char *src,size_t siz)

{
  size_t sVar1;
  long lVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  
  for (sVar4 = 0; (dst[sVar4] != '\0' && (siz != sVar4)); sVar4 = sVar4 + 1) {
  }
  if (siz - sVar4 == 0) {
    sVar1 = strlen(src);
  }
  else {
    pcVar5 = dst + sVar4;
    lVar2 = siz - sVar4;
    for (sVar1 = 0; src[sVar1] != '\0'; sVar1 = sVar1 + 1) {
      lVar3 = 1;
      if (lVar2 != 1) {
        *pcVar5 = src[sVar1];
        pcVar5 = pcVar5 + 1;
        lVar3 = lVar2 + -1;
      }
      lVar2 = lVar3;
    }
    *pcVar5 = '\0';
  }
  return sVar1 + sVar4;
}

Assistant:

size_t
hd_strlcat(char *dst, const char *src, size_t siz)
{
	register char *d = dst;
	register const char *s = src;
	register size_t n = siz;
	size_t dlen;

	/* Find the end of dst and adjust bytes left but don't go past end */
	while (*d != '\0' && n-- != 0)
		d++;
	dlen = d - dst;
	n = siz - dlen;

	if (n == 0)
		return dlen + strlen(s);
	while (*s != '\0') {
		if (n != 1) {
			*d++ = *s;
			n--;
		}
		s++;
	}
	*d = '\0';

	return dlen + (s - src);	/* count does not include NUL */
}